

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

bool __thiscall wabt::WastLexer::ReadLineComment(WastLexer *this)

{
  int iVar1;
  WastLexer *this_local;
  
  while( true ) {
    iVar1 = ReadChar(this);
    if (iVar1 == -1) {
      return false;
    }
    if (iVar1 == 10) break;
    if (iVar1 == 0xd) {
      iVar1 = PeekChar(this);
      if (iVar1 == 10) {
        ReadChar(this);
      }
      Newline(this);
      return true;
    }
  }
  Newline(this);
  return true;
}

Assistant:

bool WastLexer::ReadLineComment() {
  while (true) {
    switch (ReadChar()) {
      case kEof:
        return false;

      case '\r':
        if (PeekChar() == '\n') {
          ReadChar();
        }
        Newline();
        return true;

      case '\n':
        Newline();
        return true;
    }
  }
}